

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_9f746::SuperBlockSizeTestLarge::~SuperBlockSizeTestLarge
          (SuperBlockSizeTestLarge *this)

{
  libaom_test::EncoderTest::~EncoderTest((EncoderTest *)0x3c45ac);
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>::
  ~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode> *)
             0x3c45b6);
  return;
}

Assistant:

~SuperBlockSizeTestLarge() override = default;